

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generated_code.cc
# Opt level: O0

void __thiscall GeneratedCode_ArenaUnaligned_Test::TestBody(GeneratedCode_ArenaUnaligned_Test *this)

{
  bool bVar1;
  void *mem_00;
  upb_Arena *puVar2;
  char *pcVar3;
  AssertHelper local_4a8;
  Message local_4a0;
  ulong local_498;
  int local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_1;
  Message local_470 [3];
  ulong local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar;
  char *mem;
  upb_Arena *arena;
  char *unaligned_buf_ptr;
  uintptr_t low_bits;
  char buf1 [1024];
  GeneratedCode_ArenaUnaligned_Test *this_local;
  
  mem_00 = (void *)((ulong)&low_bits | 7);
  puVar2 = upb_Arena_Init(mem_00,(size_t)(buf1 + (0x3f8 - (long)mem_00)),(upb_alloc *)0x0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::upb_Arena_Malloc(puVar2,5);
  local_44c = 0;
  local_458 = (ulong)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl & 7;
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_448,"0","reinterpret_cast<uintptr_t>(mem) & low_bits",&local_44c,
             &local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(local_470);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/test_generated_code.cc"
               ,0x352,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  upb_Arena_Free(puVar2);
  puVar2 = upb_Arena_Init(mem_00,5,&upb_alloc_global);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::upb_Arena_Malloc(puVar2,5);
  local_48c = 0;
  local_498 = (ulong)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl & 7;
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_488,"0","reinterpret_cast<uintptr_t>(mem) & low_bits",&local_48c,
             &local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/test_generated_code.cc"
               ,0x358,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  upb_Arena_Free(puVar2);
  return;
}

Assistant:

TEST(GeneratedCode, ArenaUnaligned) {
  char buf1[1024];
  // Force the pointer to be unaligned.
  uintptr_t low_bits = UPB_MALLOC_ALIGN - 1;
  char* unaligned_buf_ptr = (char*)((uintptr_t)buf1 | low_bits);
  upb_Arena* arena = upb_Arena_Init(
      unaligned_buf_ptr, &buf1[sizeof(buf1)] - unaligned_buf_ptr, nullptr);
  char* mem = static_cast<char*>(upb_Arena_Malloc(arena, 5));
  EXPECT_EQ(0, reinterpret_cast<uintptr_t>(mem) & low_bits);
  upb_Arena_Free(arena);

  // Try the same, but with a size so small that aligning up will overflow.
  arena = upb_Arena_Init(unaligned_buf_ptr, 5, &upb_alloc_global);
  mem = static_cast<char*>(upb_Arena_Malloc(arena, 5));
  EXPECT_EQ(0, reinterpret_cast<uintptr_t>(mem) & low_bits);
  upb_Arena_Free(arena);
}